

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  byte bVar1;
  int iVar2;
  FuncState *pFVar3;
  lua_State *L;
  Proto *pPVar4;
  Dyndata *pDVar5;
  int iVar6;
  Proto **ppPVar7;
  TString *pTVar8;
  long lVar9;
  BlockCnt bl;
  FuncState new_fs;
  BlockCnt local_88;
  FuncState local_70;
  
  pFVar3 = ls->fs;
  L = ls->L;
  pPVar4 = pFVar3->f;
  iVar6 = pPVar4->sizep;
  lVar9 = (long)iVar6;
  if (iVar6 <= pFVar3->np) {
    ppPVar7 = (Proto **)luaM_growaux_(L,pPVar4->p,&pPVar4->sizep,8,0x3ffff,"functions");
    pPVar4->p = ppPVar7;
    iVar2 = pPVar4->sizep;
    if (iVar6 < iVar2) {
      do {
        pPVar4->p[lVar9] = (Proto *)0x0;
        lVar9 = lVar9 + 1;
      } while (iVar2 != lVar9);
    }
  }
  local_70.f = luaF_newproto(L);
  ppPVar7 = pPVar4->p;
  iVar6 = pFVar3->np;
  pFVar3->np = iVar6 + 1;
  ppPVar7[iVar6] = local_70.f;
  if (((pPVar4->marked & 4) != 0) && (((local_70.f)->marked & 3) != 0)) {
    luaC_barrier_(L,(GCObject *)pPVar4,(GCObject *)local_70.f);
  }
  (local_70.f)->linedefined = line;
  local_70.prev = ls->fs;
  ls->fs = &local_70;
  local_70.pc = 0;
  local_70.lasttarget = 0;
  local_70.jpc = -1;
  local_70.nk = 0;
  iVar6 = 0;
  local_70.np = 0;
  local_70.nlocvars = 0;
  local_70.nactvar = '\0';
  local_70.nups = '\0';
  local_70.freereg = '\0';
  pDVar5 = ls->dyd;
  local_70.firstlocal = (pDVar5->actvar).n;
  (local_70.f)->source = ls->source;
  (local_70.f)->maxstacksize = '\x02';
  local_70.bl = &local_88;
  local_88.isloop = '\0';
  local_88.nactvar = '\0';
  local_88.firstlabel = (pDVar5->label).n;
  local_88.firstgoto = (pDVar5->gt).n;
  local_88.upval = '\0';
  local_88.previous = (BlockCnt *)0x0;
  local_70.ls = ls;
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar8 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar8);
    adjustlocalvars(ls,1);
  }
  pFVar3 = ls->fs;
  pPVar4 = pFVar3->f;
  pPVar4->is_vararg = '\0';
  if ((ls->t).token != 0x29) {
    iVar6 = 0;
    while( true ) {
      iVar2 = (ls->t).token;
      if (iVar2 == 0x119) {
        luaX_next(ls);
        pPVar4->is_vararg = '\x01';
      }
      else {
        if (iVar2 != 0x124) {
          luaX_syntaxerror(ls,"<name> or \'...\' expected");
        }
        pTVar8 = str_checkname(ls);
        new_localvar(ls,pTVar8);
        iVar6 = iVar6 + 1;
      }
      if ((pPVar4->is_vararg != '\0') || ((ls->t).token != 0x2c)) break;
      luaX_next(ls);
    }
  }
  adjustlocalvars(ls,iVar6);
  bVar1 = pFVar3->nactvar;
  pPVar4->numparams = bVar1;
  luaK_reserveregs(pFVar3,(uint)bVar1);
  checknext(ls,0x29);
  statlist(ls);
  (local_70.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  pFVar3 = ls->fs->prev;
  iVar6 = luaK_codeABx(pFVar3,OP_CLOSURE,0,pFVar3->np - 1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOCABLE;
  (e->u).info = iVar6;
  luaK_exp2nextreg(pFVar3,e);
  close_func(ls);
  return;
}

Assistant:

static void body(LexState *ls, expdesc *e, int ismethod, int line) {
    /* body ->  '(' parlist ')' block END */
    FuncState new_fs;
    BlockCnt bl;
    new_fs.f = addprototype(ls);
    new_fs.f->linedefined = line;
    open_func(ls, &new_fs, &bl);
    checknext(ls, '(');
    if (ismethod) {
        new_localvarliteral(ls, "self");  /* create 'self' parameter */
        adjustlocalvars(ls, 1);
    }
    parlist(ls);
    checknext(ls, ')');
    statlist(ls);
    new_fs.f->lastlinedefined = ls->linenumber;
    check_match(ls, TK_END, TK_FUNCTION, line);
    codeclosure(ls, e);
    close_func(ls);
}